

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O3

void __thiscall MppThread::start(MppThread *this)

{
  int iVar1;
  pthread_attr_t attr;
  pthread_attr_t pStack_48;
  
  pthread_attr_init(&pStack_48);
  pthread_attr_setdetachstate(&pStack_48,0);
  if (this->mStatus[0] == MPP_THREAD_UNINITED) {
    this->mStatus[0] = MPP_THREAD_RUNNING;
    iVar1 = pthread_create(&this->mThread,&pStack_48,(__start_routine *)this->mFunction,
                           this->mContext);
    if (iVar1 == 0) {
      iVar1 = pthread_setname_np(this->mThread,this->mName);
      if (iVar1 != 0) {
        _mpp_log_l(2,"mpp_thread","thread %p setname %s failed\n",(char *)0x0,this->mFunction,
                   this->mName);
      }
    }
    else {
      this->mStatus[0] = MPP_THREAD_UNINITED;
    }
  }
  pthread_attr_destroy(&pStack_48);
  return;
}

Assistant:

void MppThread::start()
{
    pthread_attr_t attr;
    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);

    if (MPP_THREAD_UNINITED == get_status()) {
        // NOTE: set status here first to avoid unexpected loop quit racing condition
        set_status(MPP_THREAD_RUNNING);
        if (0 == pthread_create(&mThread, &attr, mFunction, mContext)) {
#ifndef ARMLINUX
            RK_S32 ret = pthread_setname_np(mThread, mName);
            if (ret)
                mpp_err("thread %p setname %s failed\n", mFunction, mName);
#endif

            thread_dbg(MPP_THREAD_DBG_FUNCTION, "thread %s %p context %p create success\n",
                       mName, mFunction, mContext);
        } else
            set_status(MPP_THREAD_UNINITED);
    }
    pthread_attr_destroy(&attr);
}